

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleGLCoverageTests.cpp
# Opt level: O2

void __thiscall
glcts::GLCoverageGLTexParameterHandlersAcceptZeroBaseLevelForExtensionSpecificTextureTargetsTest::
deinit(GLCoverageGLTexParameterHandlersAcceptZeroBaseLevelForExtensionSpecificTextureTargetsTest
       *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->to_id_2d != 0) {
    (**(code **)(lVar2 + 0xb8))(0x9100,0);
    (**(code **)(lVar2 + 0x480))(1,&this->to_id_2d);
  }
  if (this->to_id_2d_array != 0) {
    (**(code **)(lVar2 + 0xb8))(0x9102,0);
    (**(code **)(lVar2 + 0x480))(1,&this->to_id_2d_array);
  }
  tcu::TestNode::deinit((TestNode *)this);
  return;
}

Assistant:

void GLCoverageGLTexParameterHandlersAcceptZeroBaseLevelForExtensionSpecificTextureTargetsTest::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (to_id_2d != 0)
	{
		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, 0);
		gl.deleteTextures(1, &to_id_2d);
	}

	if (to_id_2d_array != 0)
	{
		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 0);
		gl.deleteTextures(1, &to_id_2d_array);
	}

	/* Call base class' deinit() */
	TestCase::deinit();
}